

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CColorConverter.cpp
# Opt level: O1

void irr::video::CColorConverter::convert_R5G6B5toB8G8R8(void *sP,s32 sN,void *dP)

{
  long lVar1;
  u8 *dB;
  byte *pbVar2;
  u16 *sB;
  
  if (0 < sN) {
    pbVar2 = (byte *)((long)dP + 2);
    lVar1 = 0;
    do {
      *pbVar2 = *(byte *)((long)sP + lVar1 * 2 + 1) & 0xf8;
      pbVar2[-1] = (byte)(*(ushort *)((long)sP + lVar1 * 2) >> 3) & 0xfc;
      pbVar2[-2] = *(char *)((long)sP + lVar1 * 2) << 3;
      lVar1 = lVar1 + 1;
      pbVar2 = pbVar2 + 3;
    } while (sN != (int)lVar1);
  }
  return;
}

Assistant:

void CColorConverter::convert_R5G6B5toB8G8R8(const void *sP, s32 sN, void *dP)
{
	u16 *sB = (u16 *)sP;
	u8 *dB = (u8 *)dP;

	for (s32 x = 0; x < sN; ++x) {
		dB[2] = (*sB & 0xf800) >> 8;
		dB[1] = (*sB & 0x07e0) >> 3;
		dB[0] = (*sB & 0x001f) << 3;

		sB += 1;
		dB += 3;
	}
}